

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

void __thiscall jrtplib::RTCPCompoundPacketBuilder::Report::Clear(Report *this)

{
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  *this_00;
  RTPMemoryManager *in_RDX;
  RTPMemoryManager *extraout_RDX;
  _List_node_base *p_Var1;
  
  this_00 = &this->reportblocks;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    if ((jrtplib *)p_Var1[1]._M_next != (jrtplib *)0x0) {
      RTPDeleteByteArray((jrtplib *)p_Var1[1]._M_next,(uint8_t *)(this->super_RTPMemoryObject).mgr,
                         in_RDX);
      in_RDX = extraout_RDX;
    }
  }
  std::__cxx11::
  list<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
  ::clear(this_00);
  this->isSR = false;
  this->headerlength = 0;
  return;
}

Assistant:

void Clear()
		{
			std::list<Buffer>::const_iterator it; 
			for (it = reportblocks.begin() ; it != reportblocks.end() ; it++) 
			{
				if ((*it).packetdata) 
					RTPDeleteByteArray((*it).packetdata,GetMemoryManager()); 
			}
			reportblocks.clear();
			isSR = false;
			headerlength = 0;
		}